

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::~Graph(Graph *this)

{
  Vertex *pVVar1;
  Edge *this_00;
  Vertex *this_01;
  Graph *pGVar2;
  Edge **ppEVar3;
  
  this_01 = (Vertex *)operator_new(0x78);
  Vertex::Vertex(this_01,0,1);
  pGVar2 = this;
  while( true ) {
    pVVar1 = pGVar2->verticesList;
    Vertex::~Vertex(this_01);
    operator_delete(this_01,0x78);
    if (pVVar1 == (Vertex *)0x0) break;
    ppEVar3 = &pVVar1->edgesList;
    while (this_00 = *ppEVar3, this_00 != (Edge *)0x0) {
      Edge::~Edge(this_00);
      operator_delete(this_00,0x60);
      ppEVar3 = &this_00->nextEdge;
    }
    pGVar2 = (Graph *)&pVVar1->nextVertex;
    this_01 = pVVar1;
  }
  std::_Vector_base<LoadLevel,_std::allocator<LoadLevel>_>::~_Vector_base
            (&(this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>);
  std::vector<Capacitor,_std::allocator<Capacitor>_>::~vector(&this->capacitorType);
  return;
}

Assistant:

Graph::~Graph(){
    Vertex *aux = new Vertex(0);
    for(Vertex *v=this->verticesList; v != NULL; v= v->getNext()){
        delete aux;
        for(Edge *e= v->getEdgesList(); e != NULL; e= e->getNext()){
            delete e;
        }
        aux = v;
    }
    delete aux;
}